

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiWindow *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  ImGuiID IVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  int iVar12;
  ImGuiID IVar13;
  ImGuiTabItemFlags IVar14;
  int iVar15;
  ImGuiTabItem *it;
  ImGuiTabItem *pIVar16;
  ImGuiTabItem item_tmp;
  undefined5 uStack_2d;
  undefined3 local_28;
  undefined5 uStack_25;
  undefined3 uStack_20;
  
  it = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((it != (ImGuiTabItem *)0x0) && ((it->Flags & 0x20) == 0)) {
    iVar15 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
    iVar15 = tab_bar->ReorderRequestDir + iVar15;
    if ((-1 < iVar15) && (iVar15 < (tab_bar->Tabs).Size)) {
      pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar15);
      if (((pIVar16->Flags & 0x20U) == 0) && (((pIVar16->Flags ^ it->Flags) & 0xc0U) == 0)) {
        IVar13 = it->ID;
        IVar14 = it->Flags;
        pIVar1 = it->Window;
        iVar11 = it->LastFrameVisible;
        iVar12 = it->LastFrameSelected;
        uVar2._0_4_ = it->Offset;
        uVar2._4_4_ = it->Width;
        uVar5._0_4_ = it->ContentWidth;
        uVar5._4_2_ = it->NameOffset;
        uVar5._6_2_ = it->BeginOrder;
        uVar3._0_2_ = it->IndexDuringLayout;
        uVar3._2_1_ = it->WantClose;
        uVar3._3_5_ = *(undefined5 *)&it->field_0x2b;
        local_28 = (undefined3)(undefined4)uVar5;
        uStack_25 = (undefined5)((ulong)uVar5 >> 0x18);
        uStack_20 = (undefined3)uVar3;
        uStack_2d = (undefined5)((ulong)uVar2 >> 0x18);
        IVar9 = pIVar16->ID;
        IVar10 = pIVar16->Flags;
        pIVar4 = pIVar16->Window;
        iVar15 = pIVar16->LastFrameVisible;
        iVar6 = pIVar16->LastFrameSelected;
        fVar7 = pIVar16->Offset;
        fVar8 = pIVar16->Width;
        uVar5 = *(undefined8 *)((long)&pIVar16->ContentWidth + 3);
        *(undefined8 *)((long)&it->Offset + 3) = *(undefined8 *)((long)&pIVar16->Offset + 3);
        *(undefined8 *)((long)&it->ContentWidth + 3) = uVar5;
        it->LastFrameVisible = iVar15;
        it->LastFrameSelected = iVar6;
        it->Offset = fVar7;
        it->Width = fVar8;
        it->ID = IVar9;
        it->Flags = IVar10;
        it->Window = pIVar4;
        *(ulong *)((long)&pIVar16->Offset + 3) = CONCAT35(local_28,uStack_2d);
        *(ulong *)((long)&pIVar16->ContentWidth + 3) = CONCAT35(uStack_20,uStack_25);
        pIVar16->LastFrameVisible = iVar11;
        pIVar16->LastFrameSelected = iVar12;
        pIVar16->Offset = (float)(undefined4)uVar2;
        pIVar16->Width = (float)uVar2._4_4_;
        pIVar16->ID = IVar13;
        pIVar16->Flags = IVar14;
        pIVar16->Window = pIVar1;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}